

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

void sysbvm_io_setupPrimitives(sysbvm_context_t *context)

{
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"printLine",1,2,(void *)0x0,sysbvm_io_primitive_printLine);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"print",1,2,(void *)0x0,sysbvm_io_primitive_print);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).stringType,"writeOntoStdout",1,4,(void *)0x0,
             sysbvm_io_primitive_writeOntoStdout);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).stringType,"writeOntoStderr",1,4,(void *)0x0,
             sysbvm_io_primitive_writeOntoStderr);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"IO::readWholeFileNamedAsString",1,4,(void *)0x0,
             sysbvm_io_primitive_readWholeFileNamedAsString);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"IO::readWholeFileNamedAsByteArray",1,4,(void *)0x0,
             sysbvm_io_primitive_readWholeFileNamedAsByteArray);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"IO::writeWholeFileNamedWithByteArray",2,4,(void *)0x0,
             sysbvm_io_primitive_writeWholeFileNamedWithByteArray);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"IO::writeWholeFileNamedWithString",2,4,(void *)0x0,
             sysbvm_io_primitive_writeWholeFileNamedWithByteArray);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"halt",0,4,(void *)0x0,sysbvm_io_primitive_halt);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"haltPrintingBacktrace",0,4,(void *)0x0,
             sysbvm_io_primitive_haltPrintingBacktrace);
  return;
}

Assistant:

void sysbvm_io_setupPrimitives(sysbvm_context_t *context)
{
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "printLine", 1, SYSBVM_FUNCTION_FLAGS_VARIADIC, NULL, sysbvm_io_primitive_printLine);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "print", 1, SYSBVM_FUNCTION_FLAGS_VARIADIC, NULL, sysbvm_io_primitive_print);

    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.stringType, "writeOntoStdout", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_io_primitive_writeOntoStdout);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.stringType, "writeOntoStderr", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_io_primitive_writeOntoStderr);

    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "IO::readWholeFileNamedAsString", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_io_primitive_readWholeFileNamedAsString);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "IO::readWholeFileNamedAsByteArray", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_io_primitive_readWholeFileNamedAsByteArray);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "IO::writeWholeFileNamedWithByteArray", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_io_primitive_writeWholeFileNamedWithByteArray);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "IO::writeWholeFileNamedWithString", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_io_primitive_writeWholeFileNamedWithByteArray);

    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "halt", 0, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_io_primitive_halt);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "haltPrintingBacktrace", 0, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_io_primitive_haltPrintingBacktrace);
}